

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

TObjectReflection * __thiscall glslang::TProgram::getBufferVariable(TProgram *this,int index)

{
  TReflection *pTVar1;
  pointer pTVar2;
  
  pTVar1 = this->reflection;
  if ((-1 < index) &&
     (pTVar2 = (pTVar1->indexToBufferVariable).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index < (int)((ulong)((long)(pTVar1->indexToBufferVariable).
                                 super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 4) *
             -0x33333333)) {
    return pTVar2 + (uint)index;
  }
  return &pTVar1->badReflection;
}

Assistant:

const TObjectReflection& TProgram::getBufferVariable(int index) const { return reflection->getBufferVariable(index); }